

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRError.h
# Opt level: O3

void __thiscall
MinVR::VRError::VRError
          (VRError *this,string *whatMsg,string *adviceMsg,string *whereFile,int *whereLine,
          string *whereFunc)

{
  pointer pcVar1;
  ostream *poVar2;
  stringstream ss;
  string local_1f0;
  string *local_1d0;
  string *local_1c8;
  string *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  *(undefined ***)this = &PTR__VRError_001291a0;
  (this->_whatMsg)._M_dataplus._M_p = (pointer)&(this->_whatMsg).field_2;
  pcVar1 = (whatMsg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_whatMsg,pcVar1,pcVar1 + whatMsg->_M_string_length);
  local_1c8 = &this->_adviceMsg;
  (this->_adviceMsg)._M_dataplus._M_p = (pointer)&(this->_adviceMsg).field_2;
  pcVar1 = (adviceMsg->_M_dataplus)._M_p;
  local_1c0 = &this->_whatMsg;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c8,pcVar1,pcVar1 + adviceMsg->_M_string_length);
  (this->_whereFile)._M_dataplus._M_p = (pointer)&(this->_whereFile).field_2;
  pcVar1 = (whereFile->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_whereFile,pcVar1,pcVar1 + whereFile->_M_string_length);
  (this->_whereFunc)._M_dataplus._M_p = (pointer)&(this->_whereFunc).field_2;
  pcVar1 = (whereFunc->_M_dataplus)._M_p;
  local_1d0 = &this->_whereFile;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_whereFunc,pcVar1,pcVar1 + whereFunc->_M_string_length);
  (this->_whereLine)._M_dataplus._M_p = (pointer)&(this->_whereLine).field_2;
  (this->_whereLine)._M_string_length = 0;
  (this->_whereLine).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::ostream::operator<<(local_1a8,*whereLine);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->_whereLine,(string *)&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  _errorMessage_abi_cxx11_(&local_1f0,this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

VRError(const std::string& whatMsg,
         const std::string& adviceMsg = "",
         const std::string& whereFile = "",
         const int& whereLine = 0,
         const std::string& whereFunc = ""):
  _whatMsg(whatMsg), _adviceMsg(adviceMsg),
    _whereFile(whereFile), _whereFunc(whereFunc) {

    // Convert the line number to a string.
    std::stringstream ss; ss << whereLine; _whereLine = ss.str();
	std::cerr << _errorMessage() << std::endl;
  }